

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::addStorage
          (Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this)

{
  byte bVar1;
  Entry *pEVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Entry *pEVar12;
  uchar *puVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar43;
  undefined1 auVar41 [16];
  int iVar44;
  undefined1 auVar42 [16];
  int iVar45;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar69;
  undefined1 auVar68 [16];
  int iVar70;
  long lVar71;
  long lVar79;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  long lVar80;
  long lVar81;
  
  bVar1 = this->allocated;
  if (bVar1 == 0) {
    lVar17 = 0x30;
  }
  else if (bVar1 == 0x30) {
    lVar17 = 0x50;
  }
  else {
    lVar17 = (ulong)bVar1 + 0x10;
  }
  pEVar12 = (Entry *)operator_new__((ulong)((uint)lVar17 << 7) + lVar17 * 8);
  uVar18 = (ulong)this->allocated;
  if (uVar18 != 0) {
    lVar16 = 0;
    uVar15 = 0;
    do {
      pEVar2 = this->entries;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16);
      puVar13 = (pEVar2->storage).data + lVar16;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 8);
      puVar13 = (pEVar2->storage).data + lVar16 + 8;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 8) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x10);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x10;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x10) = uVar3;
      (pEVar12->storage).data[lVar16 + 0x18] = (pEVar2->storage).data[lVar16 + 0x18];
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x20);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x20;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x20) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x28);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x28;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x28) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x30);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x30;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x30) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x38);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x38;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x38) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x40);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x40;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x40) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x48);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x48;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x48) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x50);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x50;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x50) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x58);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x58;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x58) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x60);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x60;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x60) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x68);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x68;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x68) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x70);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x70;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x70) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x78);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x78;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x78) = uVar3;
      uVar3 = *(undefined8 *)((pEVar2->storage).data + lVar16 + 0x80);
      puVar13 = (pEVar2->storage).data + lVar16 + 0x80;
      puVar13[0] = '\0';
      puVar13[1] = '\0';
      puVar13[2] = '\0';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      *(undefined8 *)((pEVar12->storage).data + lVar16 + 0x80) = uVar3;
      Node<QString,_QMimeTypeXMLData>::~Node
                ((Node<QString,_QMimeTypeXMLData> *)((this->entries->storage).data + lVar16));
      uVar15 = uVar15 + 1;
      uVar18 = (ulong)this->allocated;
      lVar16 = lVar16 + 0x88;
    } while (uVar15 < uVar18);
  }
  if ((uint)uVar18 < (uint)lVar17) {
    lVar16 = lVar17 - uVar18;
    lVar71 = uVar18 + 0xe;
    lVar79 = uVar18 + 0xf;
    lVar29 = uVar18 + 0xc;
    lVar30 = uVar18 + 0xd;
    lVar31 = uVar18 + 10;
    lVar32 = uVar18 + 0xb;
    lVar33 = uVar18 + 8;
    lVar34 = uVar18 + 9;
    lVar35 = uVar18 + 6;
    lVar36 = uVar18 + 7;
    lVar37 = uVar18 + 4;
    lVar38 = uVar18 + 5;
    lVar80 = uVar18 + 2;
    lVar81 = uVar18 + 3;
    lVar19 = uVar18 + 1;
    lVar14 = lVar16 + -1;
    auVar20._8_4_ = (int)lVar14;
    auVar20._0_8_ = lVar14;
    auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
    puVar13 = (pEVar12->storage).data + (ulong)((uint)uVar18 << 7) + uVar18 * 8;
    uVar15 = 0;
    do {
      auVar68._8_4_ = (int)uVar15;
      auVar68._0_8_ = uVar15;
      auVar68._12_4_ = (int)(uVar15 >> 0x20);
      auVar41 = auVar20 ^ _DAT_004d91f0;
      auVar39 = (auVar68 | _DAT_004da380) ^ _DAT_004d91f0;
      iVar69 = auVar41._0_4_;
      iVar45 = -(uint)(iVar69 < auVar39._0_4_);
      iVar70 = auVar41._4_4_;
      iVar56 = -(uint)(iVar70 < auVar39._4_4_);
      iVar43 = auVar41._8_4_;
      iVar57 = -(uint)(iVar43 < auVar39._8_4_);
      iVar44 = auVar41._12_4_;
      iVar58 = -(uint)(iVar44 < auVar39._12_4_);
      auVar72._4_4_ = iVar45;
      auVar72._0_4_ = iVar45;
      auVar72._8_4_ = iVar57;
      auVar72._12_4_ = iVar57;
      auVar64 = pshuflw(in_XMM12,auVar72,0xe8);
      auVar46._4_4_ = -(uint)(auVar39._4_4_ == iVar70);
      auVar46._12_4_ = -(uint)(auVar39._12_4_ == iVar44);
      auVar46._0_4_ = auVar46._4_4_;
      auVar46._8_4_ = auVar46._12_4_;
      auVar59 = pshuflw(in_XMM10,auVar46,0xe8);
      auVar40._4_4_ = iVar56;
      auVar40._0_4_ = iVar56;
      auVar40._8_4_ = iVar58;
      auVar40._12_4_ = iVar58;
      auVar41 = pshuflw(_DAT_004d91f0,auVar40,0xe8);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar41 | auVar59 & auVar64) ^ auVar39;
      auVar39 = packssdw(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *puVar13 = (char)uVar18 + '\x01';
      }
      auVar40 = auVar46 & auVar72 | auVar40;
      auVar39 = packssdw(auVar40,auVar40);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar41,auVar39 ^ auVar41);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._0_4_ >> 8 & 1) != 0) {
        puVar13[0x88] = (char)lVar19 + '\x01';
      }
      auVar39 = (auVar68 | _DAT_004da370) ^ _DAT_004d91f0;
      iVar45 = -(uint)(iVar69 < auVar39._0_4_);
      iVar57 = -(uint)(iVar70 < auVar39._4_4_);
      iVar56 = -(uint)(iVar43 < auVar39._8_4_);
      iVar58 = -(uint)(iVar44 < auVar39._12_4_);
      auVar64._4_4_ = iVar45;
      auVar64._0_4_ = iVar45;
      auVar64._8_4_ = iVar56;
      auVar64._12_4_ = iVar56;
      iVar45 = -(uint)(auVar39._4_4_ == iVar70);
      iVar56 = -(uint)(auVar39._12_4_ == iVar44);
      auVar73._4_4_ = iVar45;
      auVar73._0_4_ = iVar45;
      auVar73._8_4_ = iVar56;
      auVar73._12_4_ = iVar56;
      auVar65._4_4_ = iVar57;
      auVar65._0_4_ = iVar57;
      auVar65._8_4_ = iVar58;
      auVar65._12_4_ = iVar58;
      auVar39 = auVar73 & auVar64 | auVar65;
      auVar39 = packssdw(auVar39,auVar39);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar59,auVar39 ^ auVar59);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
        puVar13[0x110] = (char)lVar80 + '\x01';
      }
      auVar39 = pshufhw(auVar39,auVar64,0x84);
      auVar46 = pshufhw(auVar64,auVar73,0x84);
      auVar41 = pshufhw(auVar39,auVar65,0x84);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar41 | auVar46 & auVar39) ^ auVar21;
      auVar39 = packssdw(auVar21,auVar21);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._0_4_ >> 0x18 & 1) != 0) {
        puVar13[0x198] = (char)lVar81 + '\x01';
      }
      auVar39 = (auVar68 | _DAT_004da360) ^ _DAT_004d91f0;
      auVar60._0_4_ = -(uint)(iVar69 < auVar39._0_4_);
      auVar60._4_4_ = -(uint)(iVar70 < auVar39._4_4_);
      auVar60._8_4_ = -(uint)(iVar43 < auVar39._8_4_);
      auVar60._12_4_ = -(uint)(iVar44 < auVar39._12_4_);
      auVar74._4_4_ = auVar60._0_4_;
      auVar74._0_4_ = auVar60._0_4_;
      auVar74._8_4_ = auVar60._8_4_;
      auVar74._12_4_ = auVar60._8_4_;
      auVar46 = pshuflw(auVar65,auVar74,0xe8);
      auVar22._0_4_ = -(uint)(auVar39._0_4_ == iVar69);
      auVar22._4_4_ = -(uint)(auVar39._4_4_ == iVar70);
      auVar22._8_4_ = -(uint)(auVar39._8_4_ == iVar43);
      auVar22._12_4_ = -(uint)(auVar39._12_4_ == iVar44);
      auVar47._4_4_ = auVar22._4_4_;
      auVar47._0_4_ = auVar22._4_4_;
      auVar47._8_4_ = auVar22._12_4_;
      auVar47._12_4_ = auVar22._12_4_;
      auVar39 = pshuflw(auVar22,auVar47,0xe8);
      auVar48._4_4_ = auVar60._4_4_;
      auVar48._0_4_ = auVar60._4_4_;
      auVar48._8_4_ = auVar60._12_4_;
      auVar48._12_4_ = auVar60._12_4_;
      auVar41 = pshuflw(auVar60,auVar48,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 & auVar46,(auVar41 | auVar39 & auVar46) ^ auVar4);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar13[0x220] = (char)lVar37 + '\x01';
      }
      auVar48 = auVar47 & auVar74 | auVar48;
      auVar41 = packssdw(auVar48,auVar48);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39,auVar41 ^ auVar5);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._4_2_ >> 8 & 1) != 0) {
        puVar13[0x2a8] = (char)lVar38 + '\x01';
      }
      auVar39 = (auVar68 | _DAT_004da350) ^ _DAT_004d91f0;
      iVar45 = -(uint)(iVar69 < auVar39._0_4_);
      iVar57 = -(uint)(iVar70 < auVar39._4_4_);
      iVar56 = -(uint)(iVar43 < auVar39._8_4_);
      iVar58 = -(uint)(iVar44 < auVar39._12_4_);
      auVar49._4_4_ = iVar45;
      auVar49._0_4_ = iVar45;
      auVar49._8_4_ = iVar56;
      auVar49._12_4_ = iVar56;
      iVar45 = -(uint)(auVar39._4_4_ == iVar70);
      iVar56 = -(uint)(auVar39._12_4_ == iVar44);
      auVar66._4_4_ = iVar45;
      auVar66._0_4_ = iVar45;
      auVar66._8_4_ = iVar56;
      auVar66._12_4_ = iVar56;
      auVar75._4_4_ = iVar57;
      auVar75._0_4_ = iVar57;
      auVar75._8_4_ = iVar58;
      auVar75._12_4_ = iVar58;
      auVar39 = auVar66 & auVar49 | auVar75;
      auVar39 = packssdw(auVar39,auVar39);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar6,auVar39 ^ auVar6);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar13[0x330] = (char)lVar35 + '\x01';
      }
      auVar39 = pshufhw(auVar39,auVar49,0x84);
      auVar46 = pshufhw(auVar49,auVar66,0x84);
      auVar41 = pshufhw(auVar39,auVar75,0x84);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar41 | auVar46 & auVar39) ^ auVar23;
      auVar39 = packssdw(auVar23,auVar23);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._6_2_ >> 8 & 1) != 0) {
        puVar13[0x3b8] = (char)lVar36 + '\x01';
      }
      auVar39 = (auVar68 | _DAT_004da340) ^ _DAT_004d91f0;
      auVar61._0_4_ = -(uint)(iVar69 < auVar39._0_4_);
      auVar61._4_4_ = -(uint)(iVar70 < auVar39._4_4_);
      auVar61._8_4_ = -(uint)(iVar43 < auVar39._8_4_);
      auVar61._12_4_ = -(uint)(iVar44 < auVar39._12_4_);
      auVar76._4_4_ = auVar61._0_4_;
      auVar76._0_4_ = auVar61._0_4_;
      auVar76._8_4_ = auVar61._8_4_;
      auVar76._12_4_ = auVar61._8_4_;
      auVar46 = pshuflw(auVar66,auVar76,0xe8);
      auVar24._0_4_ = -(uint)(auVar39._0_4_ == iVar69);
      auVar24._4_4_ = -(uint)(auVar39._4_4_ == iVar70);
      auVar24._8_4_ = -(uint)(auVar39._8_4_ == iVar43);
      auVar24._12_4_ = -(uint)(auVar39._12_4_ == iVar44);
      auVar50._4_4_ = auVar24._4_4_;
      auVar50._0_4_ = auVar24._4_4_;
      auVar50._8_4_ = auVar24._12_4_;
      auVar50._12_4_ = auVar24._12_4_;
      auVar39 = pshuflw(auVar24,auVar50,0xe8);
      auVar51._4_4_ = auVar61._4_4_;
      auVar51._0_4_ = auVar61._4_4_;
      auVar51._8_4_ = auVar61._12_4_;
      auVar51._12_4_ = auVar61._12_4_;
      auVar41 = pshuflw(auVar61,auVar51,0xe8);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar62 = (auVar41 | auVar39 & auVar46) ^ auVar62;
      auVar41 = packssdw(auVar62,auVar62);
      auVar39 = packsswb(auVar39 & auVar46,auVar41);
      if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar13[0x440] = (char)lVar33 + '\x01';
      }
      auVar51 = auVar50 & auVar76 | auVar51;
      auVar41 = packssdw(auVar51,auVar51);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar7,auVar41 ^ auVar7);
      auVar39 = packsswb(auVar39,auVar41);
      if ((auVar39._8_2_ >> 8 & 1) != 0) {
        puVar13[0x4c8] = (char)lVar34 + '\x01';
      }
      auVar39 = (auVar68 | _DAT_004da330) ^ _DAT_004d91f0;
      iVar45 = -(uint)(iVar69 < auVar39._0_4_);
      iVar57 = -(uint)(iVar70 < auVar39._4_4_);
      iVar56 = -(uint)(iVar43 < auVar39._8_4_);
      iVar58 = -(uint)(iVar44 < auVar39._12_4_);
      auVar52._4_4_ = iVar45;
      auVar52._0_4_ = iVar45;
      auVar52._8_4_ = iVar56;
      auVar52._12_4_ = iVar56;
      iVar45 = -(uint)(auVar39._4_4_ == iVar70);
      iVar56 = -(uint)(auVar39._12_4_ == iVar44);
      auVar67._4_4_ = iVar45;
      auVar67._0_4_ = iVar45;
      auVar67._8_4_ = iVar56;
      auVar67._12_4_ = iVar56;
      auVar77._4_4_ = iVar57;
      auVar77._0_4_ = iVar57;
      auVar77._8_4_ = iVar58;
      auVar77._12_4_ = iVar58;
      auVar39 = auVar67 & auVar52 | auVar77;
      auVar39 = packssdw(auVar39,auVar39);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar8,auVar39 ^ auVar8);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        puVar13[0x550] = (char)lVar31 + '\x01';
      }
      auVar39 = pshufhw(auVar39,auVar52,0x84);
      auVar46 = pshufhw(auVar52,auVar67,0x84);
      auVar41 = pshufhw(auVar39,auVar77,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar41 | auVar46 & auVar39) ^ auVar25;
      auVar39 = packssdw(auVar25,auVar25);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._10_2_ >> 8 & 1) != 0) {
        puVar13[0x5d8] = (char)lVar32 + '\x01';
      }
      auVar39 = (auVar68 | _DAT_004da320) ^ _DAT_004d91f0;
      auVar63._0_4_ = -(uint)(iVar69 < auVar39._0_4_);
      auVar63._4_4_ = -(uint)(iVar70 < auVar39._4_4_);
      auVar63._8_4_ = -(uint)(iVar43 < auVar39._8_4_);
      auVar63._12_4_ = -(uint)(iVar44 < auVar39._12_4_);
      auVar78._4_4_ = auVar63._0_4_;
      auVar78._0_4_ = auVar63._0_4_;
      auVar78._8_4_ = auVar63._8_4_;
      auVar78._12_4_ = auVar63._8_4_;
      auVar46 = pshuflw(auVar67,auVar78,0xe8);
      auVar26._0_4_ = -(uint)(auVar39._0_4_ == iVar69);
      auVar26._4_4_ = -(uint)(auVar39._4_4_ == iVar70);
      auVar26._8_4_ = -(uint)(auVar39._8_4_ == iVar43);
      auVar26._12_4_ = -(uint)(auVar39._12_4_ == iVar44);
      auVar53._4_4_ = auVar26._4_4_;
      auVar53._0_4_ = auVar26._4_4_;
      auVar53._8_4_ = auVar26._12_4_;
      auVar53._12_4_ = auVar26._12_4_;
      auVar39 = pshuflw(auVar26,auVar53,0xe8);
      auVar54._4_4_ = auVar63._4_4_;
      auVar54._0_4_ = auVar63._4_4_;
      auVar54._8_4_ = auVar63._12_4_;
      auVar54._12_4_ = auVar63._12_4_;
      auVar41 = pshuflw(auVar63,auVar54,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 & auVar46,(auVar41 | auVar39 & auVar46) ^ auVar9);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        puVar13[0x660] = (char)lVar29 + '\x01';
      }
      auVar54 = auVar53 & auVar78 | auVar54;
      auVar41 = packssdw(auVar54,auVar54);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39,auVar41 ^ auVar10);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._12_2_ >> 8 & 1) != 0) {
        puVar13[0x6e8] = (char)lVar30 + '\x01';
      }
      auVar39 = (auVar68 | _DAT_004da310) ^ _DAT_004d91f0;
      auVar27._0_4_ = -(uint)(iVar69 < auVar39._0_4_);
      auVar27._4_4_ = -(uint)(iVar70 < auVar39._4_4_);
      auVar27._8_4_ = -(uint)(iVar43 < auVar39._8_4_);
      auVar27._12_4_ = -(uint)(iVar44 < auVar39._12_4_);
      auVar55._4_4_ = auVar27._0_4_;
      auVar55._0_4_ = auVar27._0_4_;
      auVar55._8_4_ = auVar27._8_4_;
      auVar55._12_4_ = auVar27._8_4_;
      iVar69 = -(uint)(auVar39._4_4_ == iVar70);
      iVar70 = -(uint)(auVar39._12_4_ == iVar44);
      auVar42._4_4_ = iVar69;
      auVar42._0_4_ = iVar69;
      auVar42._8_4_ = iVar70;
      auVar42._12_4_ = iVar70;
      in_XMM12._4_4_ = auVar27._4_4_;
      in_XMM12._0_4_ = auVar27._4_4_;
      in_XMM12._8_4_ = auVar27._12_4_;
      in_XMM12._12_4_ = auVar27._12_4_;
      in_XMM10 = auVar42 & auVar55 | in_XMM12;
      auVar39 = packssdw(auVar27,in_XMM10);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar11,auVar39 ^ auVar11);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        puVar13[0x770] = (char)lVar71 + '\x01';
      }
      auVar39 = pshufhw(auVar39,auVar55,0x84);
      auVar46 = pshufhw(auVar42,auVar42,0x84);
      auVar41 = pshufhw(auVar39,in_XMM12,0x84);
      auVar28._8_4_ = 0xffffffff;
      auVar28._0_8_ = 0xffffffffffffffff;
      auVar28._12_4_ = 0xffffffff;
      auVar28 = (auVar41 | auVar46 & auVar39) ^ auVar28;
      auVar39 = packssdw(auVar28,auVar28);
      auVar39 = packsswb(auVar39,auVar39);
      if ((auVar39._14_2_ >> 8 & 1) != 0) {
        puVar13[0x7f8] = (char)lVar79 + '\x01';
      }
      uVar15 = uVar15 + 0x10;
      uVar18 = uVar18 + 0x10;
      lVar19 = lVar19 + 0x10;
      lVar80 = lVar80 + 0x10;
      lVar81 = lVar81 + 0x10;
      lVar37 = lVar37 + 0x10;
      lVar38 = lVar38 + 0x10;
      lVar35 = lVar35 + 0x10;
      lVar36 = lVar36 + 0x10;
      lVar33 = lVar33 + 0x10;
      lVar34 = lVar34 + 0x10;
      lVar31 = lVar31 + 0x10;
      lVar32 = lVar32 + 0x10;
      lVar29 = lVar29 + 0x10;
      lVar30 = lVar30 + 0x10;
      lVar71 = lVar71 + 0x10;
      lVar79 = lVar79 + 0x10;
      puVar13 = puVar13 + 0x880;
    } while ((lVar16 + 0xfU & 0xfffffffffffffff0) != uVar15);
  }
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = pEVar12;
  this->allocated = (uchar)lVar17;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }